

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

string * __thiscall
picojson::_parse_number<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
          (string *__return_storage_ptr__,picojson *this,
          input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in)

{
  int iVar1;
  lconv *plVar2;
  FILE *__stream;
  FILE *__stream_00;
  char local_20;
  int ch;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in_local;
  string *num_str;
  
  __stream_00 = (FILE *)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    while ((((iVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                                ((input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>
                                  *)this,__stream_00), 0x2f < iVar1 && (iVar1 < 0x3a)) ||
            (iVar1 == 0x2b)) || (((iVar1 == 0x2d || (iVar1 == 0x65)) || (iVar1 == 0x45))))) {
      local_20 = (char)iVar1;
      __stream_00 = (FILE *)(ulong)(uint)(int)local_20;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    if (iVar1 != 0x2e) break;
    plVar2 = localeconv();
    __stream_00 = (FILE *)plVar2->decimal_point;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)__stream_00);
  }
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
            ((input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)this,
             (int)__stream_00,__stream);
  return __return_storage_ptr__;
}

Assistant:

inline std::string _parse_number(input<Iter>& in) {
    std::string num_str;
    while (1) {
      int ch = in.getc();
      if (('0' <= ch && ch <= '9') || ch == '+' || ch == '-'
          || ch == 'e' || ch == 'E') {
        num_str.push_back(ch);
      } else if (ch == '.') {
#if PICOJSON_USE_LOCALE
        num_str += localeconv()->decimal_point;
#else
        num_str.push_back('.');
#endif
      } else {
	in.ungetc();
	break;
      }
    }
    return num_str;
  }